

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# robin_hash.h
# Opt level: O2

void __thiscall
tsl::detail_robin_hash::
robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
::rehash_impl(robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
              *this,size_type count_)

{
  pointer pbVar1;
  pointer pbVar2;
  value_type *value;
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  new_table;
  allocator<std::pair<unsigned_long,_double>_> local_71;
  robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
  local_70;
  
  robin_hash(&local_70,count_,(hash<unsigned_long> *)this,(equal_to<unsigned_long> *)this,&local_71,
             this->m_min_load_factor,this->m_max_load_factor);
  pbVar2 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pbVar1 = (this->m_buckets_data).
           super__Vector_base<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  while (value = (value_type *)pbVar1->m_value, (pointer)&value[-1].second != pbVar2) {
    if (*(short *)&value[-1].second != -1) {
      insert_value_on_rehash
                (&local_70,local_70.super_power_of_two_growth_policy<2UL>.m_mask & value->first,0,
                 (truncated_hash_type)value->first,value);
    }
    pbVar1 = (pointer)(value + 1);
  }
  local_70.m_nb_elements = this->m_nb_elements;
  swap(&local_70,this);
  std::
  vector<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>,_std::allocator<tsl::detail_robin_hash::bucket_entry<std::pair<unsigned_long,_double>,_false>_>_>
  ::~vector(&local_70.m_buckets_data);
  return;
}

Assistant:

void rehash_impl(size_type count_) {
    robin_hash new_table(count_, static_cast<Hash&>(*this),
                         static_cast<KeyEqual&>(*this), get_allocator(),
                         m_min_load_factor, m_max_load_factor);
    tsl_rh_assert(size() <= new_table.m_load_threshold);

    const bool use_stored_hash =
        USE_STORED_HASH_ON_REHASH(new_table.bucket_count());
    for (auto& bucket : m_buckets_data) {
      if (bucket.empty()) {
        continue;
      }

      const std::size_t hash =
          use_stored_hash ? bucket.truncated_hash()
                          : new_table.hash_key(KeySelect()(bucket.value()));

      new_table.insert_value_on_rehash(new_table.bucket_for_hash(hash), 0,
                                       bucket_entry::truncate_hash(hash),
                                       std::move(bucket.value()));
    }

    new_table.m_nb_elements = m_nb_elements;
    new_table.swap(*this);
  }